

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_tostring.c
# Opt level: O2

int mpt_number_tostring(mpt_value *val,mpt_value_format fmt,char *dest,size_t left)

{
  longdouble *plVar1;
  char cVar2;
  uint uVar3;
  mpt_type_t mVar4;
  char *pcVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 in_R9;
  ulong uVar8;
  longdouble lVar9;
  double dVar10;
  
  mVar4 = val->_type;
  uVar3 = 0xfffffffd;
  if (mVar4 == 0) {
    return -3;
  }
  plVar1 = (longdouble *)val->_addr;
  if (((uint)fmt >> 9 & 1) == 0) {
    uVar8 = (ulong)((uint)fmt >> 0x10);
    if (left < (uVar8 & 0xff)) {
      return -0x11;
    }
  }
  else {
    uVar8 = 0;
  }
  if (mVar4 == 0x6c) {
    cVar2 = mpt_type_int(8);
    mVar4 = (mpt_type_t)cVar2;
  }
  if (0x17 < mVar4 - 0x62) {
    return -3;
  }
  uVar6 = (ulong)((uint)fmt >> 0x18);
  switch(mVar4) {
  case 0x62:
    if (((uint)fmt & 0xf) != 0) goto LAB_00110ca4;
    if (plVar1 == (longdouble *)0x0) {
LAB_00110ebd:
      uVar6 = 0;
    }
    else {
      uVar6 = (ulong)(uint)(int)*(char *)plVar1;
    }
LAB_00110ec0:
    if (((uint)fmt >> 8 & 1) == 0) {
      pcVar5 = "%*i";
    }
    else {
      pcVar5 = "%+*i";
    }
    break;
  case 99:
    if (plVar1 == (longdouble *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = (ulong)(uint)(int)*(char *)plVar1;
    }
    pcVar5 = "%*c";
    break;
  case 100:
    if (0xffffff < (uint)fmt) {
      if (((uint)fmt & 0xf0) == 0) {
        if (plVar1 == (longdouble *)0x0) {
LAB_0011107f:
          dVar10 = 0.0;
        }
        else {
          dVar10 = *(double *)plVar1;
        }
LAB_00111082:
        if (((uint)fmt >> 8 & 1) == 0) {
          pcVar5 = "%*.*f";
        }
        else {
          pcVar5 = "%+*.*f";
        }
      }
      else if (((uint)fmt & 0x10) == 0) {
        if (((uint)fmt & 0x20) == 0) {
          return -2;
        }
        if (plVar1 == (longdouble *)0x0) {
LAB_00111105:
          dVar10 = 0.0;
        }
        else {
          dVar10 = *(double *)plVar1;
        }
LAB_00111108:
        if (((uint)fmt >> 8 & 1) == 0) {
          pcVar5 = "%*.*e";
        }
        else {
          pcVar5 = "%+*.*e";
        }
      }
      else {
        if (plVar1 == (longdouble *)0x0) {
          dVar10 = 0.0;
        }
        else {
          dVar10 = *(double *)plVar1;
        }
        if (((uint)fmt >> 8 & 1) == 0) goto LAB_0011112b;
        pcVar5 = "%+*.*a";
      }
      goto LAB_00111132;
    }
    if (plVar1 == (longdouble *)0x0) {
LAB_00110eee:
      dVar10 = 0.0;
    }
    else {
      dVar10 = *(double *)plVar1;
    }
LAB_00110ef1:
    if (((uint)fmt >> 8 & 1) == 0) {
      pcVar5 = "%*g";
    }
    else {
      pcVar5 = "%+*g";
    }
    uVar3 = snprintf(dest,left,pcVar5,dVar10,uVar8 & 0xff,uVar6);
    goto LAB_0011113f;
  case 0x65:
    if ((uint)fmt < 0x1000000) {
      lVar9 = (longdouble)0;
      if (plVar1 != (longdouble *)0x0) {
        lVar9 = *plVar1;
      }
      if (((uint)fmt >> 8 & 1) == 0) {
        pcVar5 = "%*Lg";
      }
      else {
        pcVar5 = "%+*Lg";
      }
      uVar3 = snprintf(dest,left,pcVar5,uVar8 & 0xff,uVar6,in_R9,lVar9);
      goto LAB_0011113f;
    }
    if (((uint)fmt & 0xf0) == 0) {
      if (((uint)fmt >> 8 & 1) == 0) {
        pcVar5 = "%*.*Lf";
      }
      else {
        pcVar5 = "%+*.*Lf";
      }
    }
    else if (((uint)fmt & 0x10) == 0) {
      if (((uint)fmt & 0x20) == 0) {
        return -2;
      }
      if (((uint)fmt >> 8 & 1) == 0) {
        pcVar5 = "%*.*Le";
      }
      else {
        pcVar5 = "%+*.*Le";
      }
    }
    else if (((uint)fmt >> 8 & 1) == 0) {
      pcVar5 = "%*.*LA";
    }
    else {
      pcVar5 = "%+*.*LA";
    }
    break;
  case 0x66:
    if ((uint)fmt < 0x1000000) {
      if (plVar1 == (longdouble *)0x0) goto LAB_00110eee;
      dVar10 = (double)*(float *)plVar1;
      goto LAB_00110ef1;
    }
    if (((uint)fmt & 0xf0) == 0) {
      if (plVar1 == (longdouble *)0x0) goto LAB_0011107f;
      dVar10 = (double)*(float *)plVar1;
      goto LAB_00111082;
    }
    if (((uint)fmt & 0x10) == 0) {
      if (((uint)fmt & 0x20) == 0) {
        return -2;
      }
      if (plVar1 == (longdouble *)0x0) goto LAB_00111105;
      dVar10 = (double)*(float *)plVar1;
      goto LAB_00111108;
    }
    if (plVar1 == (longdouble *)0x0) {
      dVar10 = 0.0;
    }
    else {
      dVar10 = (double)*(float *)plVar1;
    }
LAB_0011112b:
    pcVar5 = "%*.*a";
LAB_00111132:
    uVar3 = snprintf(dest,left,pcVar5,dVar10,uVar8 & 0xff,uVar6);
    goto LAB_0011113f;
  default:
    goto switchD_00110c27_caseD_67;
  case 0x69:
    if (((uint)fmt & 0xf) == 0) {
      if (plVar1 == (longdouble *)0x0) goto LAB_00110ebd;
      uVar6 = (ulong)(uint)*(float *)plVar1;
      goto LAB_00110ec0;
    }
    goto LAB_00110d8c;
  case 0x6e:
    if (((uint)fmt & 0xf) == 0) {
      if (plVar1 == (longdouble *)0x0) goto LAB_00110ebd;
      uVar6 = (ulong)(uint)(int)*(short *)plVar1;
      goto LAB_00110ec0;
    }
LAB_00110d05:
    if (((uint)fmt & 1) != 0) {
      if (plVar1 == (longdouble *)0x0) goto LAB_00110e02;
      uVar6 = (ulong)*(ushort *)plVar1;
      goto LAB_00110e05;
    }
    if (((uint)fmt & 2) == 0) {
      return -2;
    }
    if (plVar1 == (longdouble *)0x0) goto LAB_00110f62;
    uVar6 = (ulong)*(ushort *)plVar1;
    goto LAB_00110f65;
  case 0x71:
    if (((uint)fmt & 0xf) != 0) goto LAB_00110d05;
    if (plVar1 == (longdouble *)0x0) {
LAB_00110f40:
      uVar6 = 0;
    }
    else {
      uVar6 = (ulong)*(ushort *)plVar1;
    }
LAB_00110f43:
    pcVar5 = "%*u";
    break;
  case 0x74:
    if (((uint)fmt & 0xf) == 0) {
      if (plVar1 == (longdouble *)0x0) {
        uVar7 = 0;
      }
      else {
        uVar7 = *(undefined8 *)plVar1;
      }
      pcVar5 = "%*lu";
    }
    else {
LAB_00110db4:
      if (((uint)fmt & 1) == 0) {
        if (((uint)fmt & 2) == 0) {
          return -2;
        }
        if (plVar1 == (longdouble *)0x0) {
          uVar7 = 0;
        }
        else {
          uVar7 = *(undefined8 *)plVar1;
        }
        pcVar5 = "%*lo";
      }
      else {
        if (plVar1 == (longdouble *)0x0) {
          uVar7 = 0;
        }
        else {
          uVar7 = *(undefined8 *)plVar1;
        }
        pcVar5 = "%*lx";
      }
    }
    goto LAB_001110c2;
  case 0x75:
    if (((uint)fmt & 0xf) == 0) {
      if (plVar1 == (longdouble *)0x0) goto LAB_00110f40;
      uVar6 = (ulong)(uint)*(float *)plVar1;
      goto LAB_00110f43;
    }
LAB_00110d8c:
    if (((uint)fmt & 1) == 0) {
      if (((uint)fmt & 2) == 0) {
        return -2;
      }
      if (plVar1 == (longdouble *)0x0) {
LAB_00110f62:
        uVar6 = 0;
      }
      else {
        uVar6 = (ulong)(uint)*(float *)plVar1;
      }
LAB_00110f65:
      pcVar5 = "%*o";
    }
    else {
      if (plVar1 == (longdouble *)0x0) {
LAB_00110e02:
        uVar6 = 0;
      }
      else {
        uVar6 = (ulong)(uint)*(float *)plVar1;
      }
LAB_00110e05:
      pcVar5 = "%*x";
    }
    break;
  case 0x78:
    if (((uint)fmt & 0xf) != 0) goto LAB_00110db4;
    if (plVar1 == (longdouble *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(undefined8 *)plVar1;
    }
    if (((uint)fmt >> 8 & 1) == 0) {
      pcVar5 = "%*li";
    }
    else {
      pcVar5 = "%+*li";
    }
LAB_001110c2:
    uVar3 = snprintf(dest,left,pcVar5,uVar8 & 0xff,uVar7);
    goto LAB_0011113f;
  case 0x79:
    if (((uint)fmt & 0xf) == 0) {
      if (plVar1 == (longdouble *)0x0) goto LAB_00110f40;
      uVar6 = (ulong)*(byte *)plVar1;
      goto LAB_00110f43;
    }
LAB_00110ca4:
    if (((uint)fmt & 1) != 0) {
      if (plVar1 == (longdouble *)0x0) goto LAB_00110e02;
      uVar6 = (ulong)*(byte *)plVar1;
      goto LAB_00110e05;
    }
    if (((uint)fmt & 2) == 0) {
      return -2;
    }
    if (plVar1 != (longdouble *)0x0) {
      uVar6 = (ulong)*(byte *)plVar1;
      goto LAB_00110f65;
    }
    goto LAB_00110f62;
  }
  uVar3 = snprintf(dest,left,pcVar5,uVar8 & 0xff,uVar6);
LAB_0011113f:
  if ((-1 < (int)uVar3) && (left <= uVar3)) {
    uVar3 = 0xffffffef;
  }
switchD_00110c27_caseD_67:
  return uVar3;
}

Assistant:

extern int mpt_number_tostring(const MPT_STRUCT(value) *val, MPT_STRUCT(value_format) fmt, char *dest, size_t left)
{
	const void *arg;
	uintptr_t type;
	int flg, sgn, len, dec;
	uint8_t wd;
	
	if (!(type = val->_type)) {
		return MPT_ERROR(BadType);
	}
	arg = val->_addr;
	
	flg = fmt.flags & 0xff;
	sgn = fmt.flags & MPT_VALFMT(Sign);
	wd  = fmt.width;
	dec = fmt.dec;
	
	if (fmt.flags & MPT_VALFMT(Left)) {
		wd = 0;
	}
	else if (wd > left) {
		return MPT_ERROR(MissingBuffer);
	}
	if (type == 'l') {
		type = mpt_type_int(sizeof(long));
	}
	switch (type) {
	/* single character */
	    case 'c':
		len = snprintf(dest, left, "%*c", wd, arg ? *((char*)arg) : 0);
		break;
	/* 8bit formats */
	    case 'b':
		if (!(flg & MPT_VALFMT(IntFlags))) {
			int8_t val = arg ? *((int8_t*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*" PRIi8, wd, val);
			} else {
				len = snprintf(dest, left, "%*" PRIi8, wd, val);
			}
			break;
		}
		/* fall through */
	    case 'y':
		if (!(flg & MPT_VALFMT(IntFlags))) {
			uint8_t val = arg ? *((uint8_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIu8, wd, val);
			break;
		}
		if (flg & MPT_VALFMT(IntHex)) {
			uint8_t val = arg ? *((uint8_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIx8, wd, val);
			break;
		}
		if (flg & MPT_VALFMT(IntOctal)) {
			uint8_t val = arg ? *((uint8_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIo8, wd, val);
			break;
		}
		return MPT_ERROR(BadValue);
	/* 16bit formats */
	    case 'n':
		if (!(flg & MPT_VALFMT(IntFlags))) {
			int16_t val = arg ? *((int16_t*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*" PRIi16, wd, val);
			} else {
				len = snprintf(dest, left, "%*" PRIi16, wd, val);
			}
			break;
		}
		/* fall through */
	    case 'q':
		if (!(flg & MPT_VALFMT(IntFlags))) {
			uint16_t val = arg ? *((uint16_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIu16, wd, val);
			break;
		}
		if (flg & MPT_VALFMT(IntHex)) {
			uint16_t val = arg ? *((uint16_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIx16, wd, val);
			break;
		}
		if (flg & MPT_VALFMT(IntOctal)) {
			uint16_t val = arg ? *((uint16_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIo16, wd, val);
			break;
		}
		return MPT_ERROR(BadValue);
	/* 32bit formats */
	    case 'i':
		if (!(flg & MPT_VALFMT(IntFlags))) {
			int32_t val = arg ? *((int32_t*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*" PRIi32, wd, val);
			} else {
				len = snprintf(dest, left, "%*" PRIi32, wd, val);
			}
			break;
		}
		/* fall through */
	    case 'u':
		if (!(flg & MPT_VALFMT(IntFlags))) {
			uint32_t val = arg ? *((uint32_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIu32, wd, val);
			break;
		}
		if (flg & MPT_VALFMT(IntHex)) {
			uint32_t val = arg ? *((uint32_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIx32, wd, val);
			break;
		}
		if (flg & MPT_VALFMT(IntOctal)) {
			uint32_t val = arg ? *((uint32_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIo32, wd, val);
			break;
		}
		return MPT_ERROR(BadValue);
	/* 64bit formats */
	    case 'x':
		if (!(flg & MPT_VALFMT(IntFlags))) {
			int64_t val = arg ? *((int64_t*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*" PRIi64, wd, val);
			} else {
				len = snprintf(dest, left, "%*" PRIi64, wd, val);
			}
			break;
		}
		/* fall through */
	    case 't':
		if (!(flg & MPT_VALFMT(IntFlags))) {
			uint64_t val = arg ? *((uint64_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIu64, wd, val);
			break;
		}
		if (flg & MPT_VALFMT(IntHex)) {
			uint64_t val = arg ? *((uint64_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIx64, wd, val);
			break;
		}
		if (flg & MPT_VALFMT(IntOctal)) {
			uint64_t val = arg ? *((uint64_t*)arg) : 0;
			len = snprintf(dest, left, "%*" PRIo64, wd, val);
			break;
		}
		return MPT_ERROR(BadValue);
	/* floating point formats */
	    case 'f':
		if (!dec) {
			float val = arg ? *((float*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*g", wd, val);
			} else {
				len = snprintf(dest, left, "%*g", wd, val);
			}
			break;
		}
		if (!(flg & MPT_VALFMT(FltFlags))) {
			float val = arg ? *((float*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*.*f", wd, dec, val);
			} else {
				len = snprintf(dest, left, "%*.*f", wd, dec, val);
			}
			break;
		}
#if __STDC_VERSION__ >= 199901L
		if (flg & MPT_VALFMT(FltHex)) {
			float val = arg ? *((float*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%*.*a", wd, dec, val);
			} else {
				len = snprintf(dest, left, "%*.*a", wd, dec, val);
			}
			break;
		}
#endif
		if (flg & MPT_VALFMT(Scientific)) {
			float val = arg ? *((float*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*.*e", wd, dec, val);
			} else {
				len = snprintf(dest, left, "%*.*e", wd, dec, val);
			}
			break;
		}
		return MPT_ERROR(BadValue);
	    case 'd':
		if (!dec) {
			double val = arg ? *((double*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*g", wd, val);
			} else {
				len = snprintf(dest, left, "%*g", wd, val);
			}
			break;
		}
		if (!(flg & MPT_VALFMT(FltFlags))) {
			double val = arg ? *((double*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*.*f", wd, dec, val);
			} else {
				len = snprintf(dest, left, "%*.*f", wd, dec, val);
			}
			break;
		}
#if __STDC_VERSION__ >= 199901L
		if (flg & MPT_VALFMT(FltHex)) {
			double val = arg ? *((double*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*.*a", wd, dec, val);
			} else {
				len = snprintf(dest, left, "%*.*a", wd, dec, val);
			}
			break;
		}
#endif
		if (flg & MPT_VALFMT(Scientific)) {
			double val = arg ? *((double*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*.*e", wd, dec, val);
			} else {
				len = snprintf(dest, left, "%*.*e", wd, dec, val);
			}
			break;
		}
		return MPT_ERROR(BadValue);
#ifdef _MPT_FLOAT_EXTENDED_H
	    case 'e':
		if (!dec) {
			long double val = arg ? *((long double*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*Lg", wd, val);
			} else {
				len = snprintf(dest, left, "%*Lg", wd, val);
			}
			break;
		}
		if (!(flg & MPT_VALFMT(FltFlags))) {
			long double val = arg ? *((long double*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*.*Lf", wd, dec, val);
			} else {
				len = snprintf(dest, left, "%*.*Lf", wd, dec, val);
			}
			break;
		}
# if __STDC_VERSION__ >= 199901L
		if (flg & MPT_VALFMT(FltHex)) {
			long double val = arg ? *((long double*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*.*LA", wd, dec, val);
			} else {
				len = snprintf(dest, left, "%*.*LA", wd, dec, val);
			}
			break;
		}
# endif
		if (flg & MPT_VALFMT(Scientific)) {
			long double val = arg ? *((long double*)arg) : 0;
			if (sgn) {
				len = snprintf(dest, left, "%+*.*Le", wd, dec, val);
			} else {
				len = snprintf(dest, left, "%*.*Le", wd, dec, val);
			}
			break;
		}
		return MPT_ERROR(BadValue);
#endif /* _MPT_FLOAT_EXTENDED_H */
	    default:
		return MPT_ERROR(BadType);
	}
	if (len < 0) {
		return len;
	}
	if ((size_t) len >= left) {
		return MPT_ERROR(MissingBuffer);
	}
	if (flg & MPT_VALFMT(Left)) {
		wd = fmt.width;
		if (left < (size_t) wd) {
			return MPT_ERROR(MissingBuffer);
		}
		wd -= len;
		while (wd-- > 0) {
			dest[len++] = ' ';
		}
		if ((size_t) len < left) {
			dest[len] = 0;
		}
	}
	return len;
}